

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

void __thiscall cmMakefile::LogUnused(cmMakefile *this,char *reason,string *name)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  cmake *this_00;
  byte local_392;
  byte local_361;
  string local_348;
  undefined1 local_328 [8];
  ostringstream msg;
  bool local_1aa;
  allocator local_1a9;
  string local_1a8;
  byte local_183;
  byte local_182;
  allocator local_181;
  string local_180;
  byte local_15b;
  byte local_15a;
  allocator local_159;
  string local_158;
  string local_138;
  cmState *local_118;
  cmLinkedTree<cmState::SnapshotDataType> *pcStack_110;
  PositionType local_108;
  undefined1 local_100 [8];
  cmOutputConverter converter;
  undefined1 local_88 [8];
  cmListFileContext lfc;
  string path;
  string *name_local;
  char *reason_local;
  cmMakefile *this_local;
  
  if ((this->WarnUnused & 1U) != 0) {
    std::__cxx11::string::string((string *)&lfc.Line);
    cmListFileContext::cmListFileContext((cmListFileContext *)local_88);
    bVar1 = std::vector<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>::
            empty(&this->CallStack);
    if (bVar1) {
      pcVar2 = GetCurrentSourceDirectory(this);
      std::__cxx11::string::operator=((string *)&lfc.Line,pcVar2);
      std::__cxx11::string::operator+=((string *)&lfc.Line,"/CMakeLists.txt");
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&lfc.Line);
      lfc.FilePath.field_2._8_8_ = 0;
    }
    else {
      GetExecutionContext((cmListFileContext *)&converter.LinkScriptShell,this);
      cmListFileContext::operator=
                ((cmListFileContext *)local_88,(cmListFileContext *)&converter.LinkScriptShell);
      cmListFileContext::~cmListFileContext((cmListFileContext *)&converter.LinkScriptShell);
      std::__cxx11::string::operator=
                ((string *)&lfc.Line,(string *)(lfc.Name.field_2._M_local_buf + 8));
    }
    local_108 = (this->StateSnapshot).Position.Position;
    local_118 = (this->StateSnapshot).State;
    pcStack_110 = (this->StateSnapshot).Position.Tree;
    cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_100,this->StateSnapshot);
    cmOutputConverter::Convert
              (&local_138,(cmOutputConverter *)local_100,(string *)((long)&lfc.Name.field_2 + 8),
               HOME,UNCHANGED);
    std::__cxx11::string::operator=
              ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    local_15a = 0;
    local_15b = 0;
    local_182 = 0;
    local_183 = 0;
    local_1aa = false;
    local_361 = 1;
    if ((this->CheckSystemVars & 1U) == 0) {
      pcVar2 = GetHomeDirectory(this);
      std::allocator<char>::allocator();
      local_15a = 1;
      std::__cxx11::string::string((string *)&local_158,pcVar2,&local_159);
      local_15b = 1;
      bVar1 = cmsys::SystemTools::IsSubDirectory((string *)&lfc.Line,&local_158);
      local_361 = 1;
      if (!bVar1) {
        pcVar2 = GetHomeOutputDirectory(this);
        std::allocator<char>::allocator();
        local_182 = 1;
        std::__cxx11::string::string((string *)&local_180,pcVar2,&local_181);
        local_183 = 1;
        local_1aa = cmsys::SystemTools::IsSubDirectory((string *)&lfc.Line,&local_180);
        local_392 = 0;
        if (local_1aa) {
          pcVar2 = cmake::GetCMakeFilesDirectory();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1a8,pcVar2,&local_1a9);
          bVar1 = cmsys::SystemTools::IsSubDirectory((string *)&lfc.Line,&local_1a8);
          local_392 = bVar1 ^ 0xff;
        }
        local_361 = local_392;
      }
    }
    if (local_1aa != false) {
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
    }
    if ((local_183 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_180);
    }
    if ((local_182 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
    }
    if ((local_15b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_158);
    }
    if ((local_15a & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_159);
    }
    if ((local_361 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
      poVar3 = std::operator<<((ostream *)local_328,"unused variable (");
      poVar3 = std::operator<<(poVar3,reason);
      poVar3 = std::operator<<(poVar3,") \'");
      poVar3 = std::operator<<(poVar3,(string *)name);
      std::operator<<(poVar3,"\'");
      this_00 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      cmake::IssueMessage(this_00,AUTHOR_WARNING,&local_348,(cmListFileContext *)local_88);
      std::__cxx11::string::~string((string *)&local_348);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
    }
    cmListFileContext::~cmListFileContext((cmListFileContext *)local_88);
    std::__cxx11::string::~string((string *)&lfc.Line);
  }
  return;
}

Assistant:

void cmMakefile::LogUnused(const char* reason,
                                const std::string& name) const
{
  if (this->WarnUnused)
    {
    std::string path;
    cmListFileContext lfc;
    if (!this->CallStack.empty())
      {
      lfc = this->GetExecutionContext();
      path = lfc.FilePath;
      }
    else
      {
      path = this->GetCurrentSourceDirectory();
      path += "/CMakeLists.txt";
      lfc.FilePath = path;
      lfc.Line = 0;
      }
    cmOutputConverter converter(this->StateSnapshot);
    lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);

    if (this->CheckSystemVars ||
        cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeDirectory()) ||
        (cmSystemTools::IsSubDirectory(path,
                                      this->GetHomeOutputDirectory()) &&
        !cmSystemTools::IsSubDirectory(path,
                                cmake::GetCMakeFilesDirectory())))
      {
      std::ostringstream msg;
      msg << "unused variable (" << reason << ") \'" << name << "\'";
      this->GetCMakeInstance()->IssueMessage(cmake::AUTHOR_WARNING,
                                             msg.str(),
                                             lfc);
      }
    }
}